

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool ON_SubDEdgeSharpness::IsConstant(size_t edge_count,ON_SubDEdgePtr *edges,bool bCreaseResult)

{
  ulong uVar1;
  ON_SubDEdgeSharpness OVar2;
  ON_SubDEdgeSharpness OVar3;
  bool bVar4;
  ON_SubDEdge *edge;
  ON_SubDEdge *pOVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float local_38;
  float fStack_34;
  
  if (edges == (ON_SubDEdgePtr *)0x0 || edge_count == 0) {
    return false;
  }
  uVar1 = edges->m_ptr;
  pOVar5 = (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8);
  if (pOVar5 == (ON_SubDEdge *)0x0) {
    fVar8 = Nan.m_edge_sharpness[0];
    fVar9 = Nan.m_edge_sharpness[1];
  }
  else {
    OVar2 = ON_SubDEdge::Sharpness(pOVar5,true);
    fVar8 = OVar2.m_edge_sharpness[0];
    fVar9 = OVar2.m_edge_sharpness[1];
    if ((uVar1 & 1) != 0) {
      fVar8 = OVar2.m_edge_sharpness[1];
      fVar9 = OVar2.m_edge_sharpness[0];
    }
  }
  OVar2.m_edge_sharpness = Nan.m_edge_sharpness;
  if (fVar8 != fVar9) {
    return false;
  }
  if (NAN(fVar8) || NAN(fVar9)) {
    return false;
  }
  if (0.0 <= fVar8) {
    if (fVar8 <= 4.0 || !bCreaseResult) {
      if (pOVar5 == (ON_SubDEdge *)0x0) {
        return false;
      }
      if (4.0 < fVar8) {
        return false;
      }
      goto LAB_005c888e;
    }
  }
  else if (!bCreaseResult) {
    return false;
  }
  if (pOVar5 == (ON_SubDEdge *)0x0) {
    return false;
  }
  if (fVar8 != 5.0) {
    return false;
  }
  if (NAN(fVar8)) {
    return false;
  }
LAB_005c888e:
  if (pOVar5->m_vertex[(uint)uVar1 & 1] == (ON_SubDVertex *)0x0) {
    return false;
  }
  lVar6 = 0;
  while( true ) {
    uVar1 = edges[lVar6].m_ptr;
    local_38 = OVar2.m_edge_sharpness[0];
    fStack_34 = OVar2.m_edge_sharpness[1];
    pOVar5 = (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8);
    if (pOVar5 != (ON_SubDEdge *)0x0) {
      OVar3 = ON_SubDEdge::Sharpness(pOVar5,true);
      local_38 = OVar3.m_edge_sharpness[0];
      fStack_34 = OVar3.m_edge_sharpness[1];
      if ((uVar1 & 1) != 0) {
        local_38 = OVar3.m_edge_sharpness[1];
        fStack_34 = OVar3.m_edge_sharpness[0];
      }
    }
    bVar4 = fStack_34 == fVar8 && fVar8 == local_38;
    if (fStack_34 != fVar8 || fVar8 != local_38) break;
    bVar7 = edge_count - 1 == lVar6;
    lVar6 = lVar6 + 1;
    if (bVar7) {
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool ON_SubDEdgeSharpness::IsConstant(
  size_t edge_count,
  const ON_SubDEdgePtr* edges,
  bool bCreaseResult
)
{
  if (edge_count < 1 || nullptr == edges)
    return false;
  
  ON_SubDEdgeSharpness s = edges[0].RelativeSharpness(true);
  if (false == s.IsConstant(bCreaseResult))
    return false;
  const double c = s[0];
  if (nullptr == edges[0].RelativeVertex(0))
    return false; // not an edge chain
  for (size_t i = 0; i < edge_count; ++i)
  {
    s = edges[i].RelativeSharpness(true);
    if ( false == (c == s.EndSharpness(0) && c == s.EndSharpness(1)))
      return false;
  }

  return true;
}